

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuMatrix.hpp
# Opt level: O2

void __thiscall tcu::Matrix<double,_2,_3>::Matrix(Matrix<double,_2,_3> *this,double *src)

{
  int row;
  long lVar1;
  long lVar2;
  
  Vector<tcu::Vector<double,_2>,_3>::Vector(&this->m_data);
  for (lVar1 = 0; lVar1 != 2; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 0x18; lVar2 = lVar2 + 8) {
      *(undefined8 *)((long)this + lVar2 * 2) = *(undefined8 *)((long)src + lVar2);
    }
    src = src + 3;
    this = (Matrix<double,_2,_3> *)((long)this + 8);
  }
  return;
}

Assistant:

Matrix<T, Rows, Cols>::Matrix (const T src[Rows*Cols])
{
	for (int row = 0; row < Rows; row++)
		for (int col = 0; col < Cols; col++)
			(*this)(row, col) = src[row*Cols + col];
}